

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

void Tas_ManWatchClause(Tas_Man_t *p,Tas_Cls_t *pClause,int Lit)

{
  uint Entry;
  
  if (Lit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  if (p->pAig->nObjs <= (int)((uint)Lit >> 1)) {
    __assert_fail("Abc_Lit2Var(Lit) < Gia_ManObjNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x3bc,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
  }
  if (pClause->nLits < 2) {
    __assert_fail("pClause->nLits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x3bd,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
  }
  if (pClause[1].iNext[0] != Lit) {
    if (pClause[1].iNext[1] != Lit) {
      __assert_fail("pClause->pLits[0] == Lit || pClause->pLits[1] == Lit",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                    ,0x3be,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
    }
    if (pClause[1].iNext[0] != Lit) {
      pClause->iNext[1] = p->pWatches[Lit ^ 1];
      goto LAB_00698f2f;
    }
  }
  pClause->iNext[0] = p->pWatches[Lit ^ 1];
LAB_00698f2f:
  Entry = Lit ^ 1;
  if (p->pWatches[Entry] == 0) {
    Vec_IntPush(p->vWatchLits,Entry);
  }
  p->pWatches[Entry] = (int)((ulong)((long)pClause - (long)(p->pStore).pData) >> 2);
  return;
}

Assistant:

static inline void Tas_ManWatchClause( Tas_Man_t * p, Tas_Cls_t * pClause, int Lit )
{
    assert( Abc_Lit2Var(Lit) < Gia_ManObjNum(p->pAig) );
    assert( pClause->nLits >= 2 );
    assert( pClause->pLits[0] == Lit || pClause->pLits[1] == Lit );
    if ( pClause->pLits[0] == Lit )
        pClause->iNext[0] = p->pWatches[Abc_LitNot(Lit)];  
    else
        pClause->iNext[1] = p->pWatches[Abc_LitNot(Lit)];  
    if ( p->pWatches[Abc_LitNot(Lit)] == 0 )
        Vec_IntPush( p->vWatchLits, Abc_LitNot(Lit) );
    p->pWatches[Abc_LitNot(Lit)] = Tas_ClsHandle( p, pClause );
}